

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::AcesInputFile::readPixels(AcesInputFile *this,int scanLine1,int scanLine2)

{
  int iVar1;
  int *piVar2;
  half *in_RDI;
  float a;
  float b;
  float c;
  V3f aces;
  int x;
  Rgba *base;
  int in_stack_00000038;
  int y;
  int maxY;
  int minY;
  Matrix44<float> *in_stack_ffffffffffffffc0;
  Vec3<float> *in_stack_ffffffffffffffc8;
  int local_2c;
  int local_1c;
  int local_10;
  int local_c [3];
  
  RgbaInputFile::readPixels(_maxY,y,in_stack_00000038);
  if ((*(byte *)(*(long *)(in_RDI + 4) + 0x28) & 1) != 0) {
    piVar2 = std::min<int>(local_c,&local_10);
    local_1c = *piVar2;
    piVar2 = std::max<int>(local_c,&local_10);
    iVar1 = *piVar2;
    for (; local_1c <= iVar1; local_1c = local_1c + 1) {
      for (local_2c = *(int *)(*(long *)(in_RDI + 4) + 0x20);
          local_2c <= *(int *)(*(long *)(in_RDI + 4) + 0x24); local_2c = local_2c + 1) {
        a = Imath_3_2::half::operator_cast_to_float(in_RDI);
        b = Imath_3_2::half::operator_cast_to_float(in_RDI);
        c = Imath_3_2::half::operator_cast_to_float(in_RDI);
        Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffffbc,a,b,c);
        Imath_3_2::operator*(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        Imath_3_2::Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffffc8,0);
        Imath_3_2::half::operator=(in_RDI,a);
        Imath_3_2::Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffffc8,1);
        Imath_3_2::half::operator=(in_RDI,a);
        Imath_3_2::Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffffc8,2);
        Imath_3_2::half::operator=(in_RDI,a);
      }
    }
  }
  return;
}

Assistant:

void
AcesInputFile::readPixels (int scanLine1, int scanLine2)
{
    //
    // Copy the pixels from the RgbaInputFile into the frame buffer.
    //

    _data->rgbaFile->readPixels (scanLine1, scanLine2);

    //
    // If the RGB space of the input file is not the same as the ACES
    // RGB space, then the pixels in the frame buffer must be transformed
    // into the ACES RGB space.
    //

    if (!_data->mustConvertColor) return;

    int minY = min (scanLine1, scanLine2);
    int maxY = max (scanLine1, scanLine2);

    for (int y = minY; y <= maxY; ++y)
    {
        Rgba* base = _data->fbBase + _data->fbXStride * _data->minX +
                     _data->fbYStride * y;

        for (int x = _data->minX; x <= _data->maxX; ++x)
        {
            V3f aces = V3f (base->r, base->g, base->b) * _data->fileToAces;

            base->r = aces[0];
            base->g = aces[1];
            base->b = aces[2];

            base += _data->fbXStride;
        }
    }
}